

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

DPIExportSyntax * __thiscall
slang::parsing::Parser::parseDPIExport(Parser *this,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token c_identifier_00;
  Token equals_00;
  Token functionOrTask_00;
  Token name_00;
  Token semi_00;
  bool bVar1;
  DPIExportSyntax *pDVar2;
  Parser *in_RDI;
  Token TVar3;
  Token TVar4;
  Token keyword_00;
  Token semi;
  Token name;
  Token functionOrTask;
  Token equals;
  Token c_identifier;
  Token specString;
  Token keyword;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffe10;
  undefined6 in_stack_fffffffffffffe18;
  TokenKind in_stack_fffffffffffffe1e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe20;
  ParserBase *in_stack_fffffffffffffe30;
  TokenKind in_stack_fffffffffffffe9e;
  ParserBase *in_stack_fffffffffffffea0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  
  ParserBase::consume(in_stack_fffffffffffffe30);
  TVar3 = parseDPISpecString(in_RDI);
  Token::Token((Token *)in_stack_fffffffffffffe10);
  Token::Token((Token *)in_stack_fffffffffffffe10);
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe20._M_extent_value,
                           in_stack_fffffffffffffe1e);
  if (bVar1) {
    TVar4 = ParserBase::consume(in_stack_fffffffffffffe30);
    local_80 = TVar4._0_8_;
    local_60 = local_80;
    local_78 = TVar4.info;
    local_58 = local_78;
    TVar4 = ParserBase::expect(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9e);
    local_90 = TVar4._0_8_;
    local_70 = local_90;
    local_88 = TVar4.info;
    local_68 = local_88;
  }
  Token::Token((Token *)in_stack_fffffffffffffe10);
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe20._M_extent_value,
                           in_stack_fffffffffffffe1e);
  if (bVar1) {
    TVar4 = ParserBase::consume(in_stack_fffffffffffffe30);
    local_b0 = TVar4._0_8_;
    local_a0 = local_b0;
    local_a8 = TVar4.info;
    local_98 = local_a8;
  }
  else {
    TVar4 = ParserBase::expect(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9e);
    local_c0 = TVar4._0_8_;
    local_a0 = local_c0;
    local_b8 = TVar4.info;
    local_98 = local_b8;
  }
  TVar4 = ParserBase::expect(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9e);
  keyword_00 = ParserBase::expect(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9e);
  elements._M_ptr._6_2_ = in_stack_fffffffffffffe1e;
  elements._M_ptr._0_6_ = in_stack_fffffffffffffe18;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffe20._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (in_stack_fffffffffffffe10,elements);
  local_50 = TVar3._0_8_;
  local_d0 = TVar4._0_8_;
  local_c8 = TVar4.info;
  local_d8 = keyword_00.info;
  c_identifier_00.info = local_d0;
  c_identifier_00._0_8_ = local_d8;
  equals_00.info = (Info *)local_a0;
  equals_00._0_8_ = local_c8;
  functionOrTask_00.info._0_6_ = (int6)local_70;
  functionOrTask_00._0_8_ = local_98;
  functionOrTask_00.info._6_2_ = (short)((ulong)local_70 >> 0x30);
  name_00.info = local_60;
  name_00._0_8_ = local_68;
  semi_00.info = local_50;
  semi_00._0_8_ = local_58;
  pDVar2 = slang::syntax::SyntaxFactory::dPIExport
                     ((SyntaxFactory *)local_98,local_a0,keyword_00,TVar4,c_identifier_00,equals_00,
                      functionOrTask_00,name_00,semi_00);
  return pDVar2;
}

Assistant:

DPIExportSyntax& Parser::parseDPIExport(AttrList attributes) {
    Token keyword = consume();
    Token specString = parseDPISpecString();

    Token c_identifier, equals;
    if (peek(TokenKind::Identifier)) {
        c_identifier = consume();
        equals = expect(TokenKind::Equals);
    }

    Token functionOrTask;
    if (peek(TokenKind::TaskKeyword))
        functionOrTask = consume();
    else
        functionOrTask = expect(TokenKind::FunctionKeyword);

    Token name = expect(TokenKind::Identifier);
    Token semi = expect(TokenKind::Semicolon);
    return factory.dPIExport(attributes, keyword, specString, c_identifier, equals, functionOrTask,
                             name, semi);
}